

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64.hpp
# Opt level: O3

void __thiscall trng::lcg64::split(lcg64 *this,uint s,uint n)

{
  result_type rVar1;
  byte bVar2;
  uint i;
  long lVar3;
  result_type rVar4;
  long lVar5;
  ulong uVar6;
  result_type rVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  result_type rVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  result_type rVar17;
  bool bVar18;
  invalid_argument local_40 [16];
  
  if (s <= n) {
    std::invalid_argument::invalid_argument(local_40,"invalid argument for trng::lcg64::split");
    utility::throw_this<std::invalid_argument>(local_40);
    std::invalid_argument::~invalid_argument(local_40);
  }
  if (1 < s) {
    uVar9 = (ulong)n + 1;
    rVar1 = (this->P).b;
    if (n < 0xf) {
      rVar17 = (this->P).a;
      rVar4 = (this->S).r;
      do {
        rVar4 = rVar4 * rVar17 + rVar1;
        uVar8 = (int)uVar9 - 1;
        uVar9 = (ulong)uVar8;
      } while (uVar8 != 0);
      (this->S).r = rVar4;
    }
    else {
      rVar17 = (this->P).a;
      rVar4 = (this->S).r;
      bVar2 = 0;
      do {
        if ((uVar9 & 1) != 0) {
          uVar13 = 1L << (bVar2 & 0x3f);
          lVar3 = 1;
          rVar12 = rVar17;
          uVar10 = uVar13;
          do {
            rVar7 = rVar12;
            if ((uVar10 & 1) == 0) {
              rVar7 = 1;
            }
            lVar3 = lVar3 * rVar7;
            rVar12 = rVar12 * rVar12;
            bVar18 = 1 < uVar10;
            uVar10 = uVar10 >> 1;
          } while (bVar18);
          uVar10 = uVar13 >> 1;
          if (uVar10 == 0) {
            uVar6 = 0x40;
          }
          else {
            uVar6 = 0x3f;
            if (uVar10 != 0) {
              for (; uVar10 >> uVar6 == 0; uVar6 = uVar6 - 1) {
              }
            }
            uVar6 = uVar6 ^ 0x3f;
          }
          uVar10 = 0;
          lVar11 = 0;
          rVar12 = rVar17;
          do {
            if ((uVar13 >> (uVar10 & 0x3f) & 1) != 0) {
              lVar14 = 1;
              rVar7 = rVar17;
              for (uVar15 = uVar10; uVar15 != 0; uVar15 = uVar15 - 1) {
                lVar14 = lVar14 * (rVar7 + 1);
                rVar7 = rVar7 * rVar7;
              }
              lVar11 = lVar11 * rVar12 + lVar14;
            }
            rVar12 = rVar12 * rVar12;
            uVar10 = uVar10 + 1;
          } while (uVar10 != 0x41 - uVar6);
          rVar4 = lVar11 * rVar1 + lVar3 * rVar4;
          (this->S).r = rVar4;
        }
        bVar2 = bVar2 + 1;
        bVar18 = 1 < uVar9;
        uVar9 = uVar9 >> 1;
      } while (bVar18);
    }
    uVar8 = s >> 1;
    if (uVar8 == 0) {
      uVar9 = 0x40;
    }
    else {
      uVar9 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar9 = uVar9 ^ 0x3f;
    }
    lVar3 = 0;
    lVar11 = 0;
    rVar12 = rVar17;
    do {
      if (((uint)(1L << ((byte)lVar3 & 0x3f)) & s) != 0) {
        lVar14 = 1;
        rVar7 = rVar17;
        for (lVar5 = lVar3; lVar5 != 0; lVar5 = lVar5 + -1) {
          lVar14 = lVar14 * (rVar7 + 1);
          rVar7 = rVar7 * rVar7;
        }
        lVar11 = lVar11 * rVar12 + lVar14;
      }
      rVar12 = rVar12 * rVar12;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x41 - uVar9);
    (this->P).b = rVar1 * lVar11;
    rVar12 = 1;
    uVar9 = (ulong)s;
    do {
      rVar7 = rVar17;
      if ((uVar9 & 1) == 0) {
        rVar7 = 1;
      }
      rVar12 = rVar12 * rVar7;
      rVar17 = rVar17 * rVar17;
      bVar18 = 1 < uVar9;
      uVar9 = uVar9 >> 1;
    } while (bVar18);
    (this->P).a = rVar12;
    lVar3 = 0;
    do {
      uVar10 = 1L << ((byte)lVar3 & 0x3f);
      lVar14 = 1;
      rVar17 = rVar12;
      uVar9 = uVar10;
      do {
        rVar7 = rVar17;
        if ((uVar9 & 1) == 0) {
          rVar7 = 1;
        }
        lVar14 = lVar14 * rVar7;
        rVar17 = rVar17 * rVar17;
        bVar18 = 1 < uVar9;
        uVar9 = uVar9 >> 1;
      } while (bVar18);
      uVar9 = uVar10 >> 1;
      if (uVar9 == 0) {
        uVar13 = 0x40;
      }
      else {
        uVar13 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> uVar13 == 0; uVar13 = uVar13 - 1) {
          }
        }
        uVar13 = uVar13 ^ 0x3f;
      }
      uVar9 = 0;
      lVar5 = 0;
      rVar17 = rVar12;
      do {
        if ((uVar10 >> (uVar9 & 0x3f) & 1) != 0) {
          lVar16 = 1;
          rVar7 = rVar12;
          for (uVar6 = uVar9; uVar6 != 0; uVar6 = uVar6 - 1) {
            lVar16 = lVar16 * (rVar7 + 1);
            rVar7 = rVar7 * rVar7;
          }
          lVar5 = lVar5 * rVar17 + lVar16;
        }
        rVar17 = rVar17 * rVar17;
        uVar9 = uVar9 + 1;
      } while (uVar9 != 0x41 - uVar13);
      rVar4 = lVar5 * rVar1 * lVar11 + rVar4 * lVar14;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    (this->S).r = rVar4;
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void lcg64::split(unsigned int s, unsigned int n) {
#if !(defined TRNG_CUDA)
    if (s < 1 or n >= s)
      utility::throw_this(std::invalid_argument("invalid argument for trng::lcg64::split"));
#endif
    if (s > 1) {
      jump(n + 1ull);
      P.b *= f(s, P.a);
      P.a = pow(P.a, s);
      backward();
    }
  }